

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManFilterEquivsForSpeculation
              (Gia_Man_t *pGia,char *pName1,char *pName2,int fLatchA,int fLatchB)

{
  Gia_Rpr_t GVar1;
  ulong uVar2;
  int *piVar3;
  Gia_Rpr_t *pGVar4;
  int iVar5;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  uint local_38;
  
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    pcVar12 = "Equivalences are not defined.\n";
LAB_002040aa:
    Abc_Print(1,pcVar12);
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      pcVar12 = "Cannot read first file %s.\n";
      pName2 = pName1;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 != (Gia_Man_t *)0x0) {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          pcVar12 = "Cannot create sequential miter.\n";
        }
        else if (pGia->nObjs == p->nObjs) {
          iVar5 = bcmp(pGia->pObjs,p->pObjs,(long)pGia->nObjs * 0xc);
          if (iVar5 == 0) {
            Gia_ManCleanMark0(pGia);
            if (0 < p0->nObjs) {
              lVar6 = 8;
              lVar8 = 0;
              do {
                if (p0->pObjs == (Gia_Obj_t *)0x0) break;
                uVar11 = *(uint *)(&p0->pObjs->field_0x0 + lVar6);
                if (uVar11 != 0xffffffff) {
                  if ((int)uVar11 < 0) goto LAB_002044fd;
                  uVar11 = uVar11 >> 1;
                  if ((p->nObjs <= (int)uVar11) || (pGia->nObjs <= (int)uVar11)) goto LAB_002044de;
                  *(ulong *)(pGia->pObjs + uVar11) = *(ulong *)(pGia->pObjs + uVar11) | 0x40000000;
                }
                lVar8 = lVar8 + 1;
                lVar6 = lVar6 + 0xc;
              } while (lVar8 < p0->nObjs);
            }
            Gia_ManCleanMark1(pGia);
            if (0 < p1->nObjs) {
              lVar6 = 8;
              lVar8 = 0;
              do {
                if (p1->pObjs == (Gia_Obj_t *)0x0) break;
                uVar11 = *(uint *)(&p1->pObjs->field_0x0 + lVar6);
                if (uVar11 != 0xffffffff) {
                  if ((int)uVar11 < 0) {
LAB_002044fd:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar11 = uVar11 >> 1;
                  if ((p->nObjs <= (int)uVar11) || (pGia->nObjs <= (int)uVar11)) {
LAB_002044de:
                    __assert_fail("v >= 0 && v < p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                  }
                  *(ulong *)(pGia->pObjs + uVar11) =
                       *(ulong *)(pGia->pObjs + uVar11) | 0x4000000000000000;
                }
                lVar8 = lVar8 + 1;
                lVar6 = lVar6 + 0xc;
              } while (lVar8 < p1->nObjs);
            }
            if (1 < pGia->nObjs) {
              lVar6 = 1;
              do {
                GVar1 = pGia->pReprs[lVar6];
                if ((((uint)GVar1 & 0xfffffff) == 0) &&
                   (pGia->pReprs[lVar6] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff),
                   pGia->pNexts[lVar6] != 0)) {
                  __assert_fail("pGia->pNexts[i] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                ,0x8e6,
                                "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                               );
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < pGia->nObjs);
            }
            uVar13 = (ulong)(uint)pGia->nObjs;
            local_38 = 0;
            if (1 < pGia->nObjs) {
              local_38 = 0;
              uVar7 = 1;
              do {
                if ((((uint)pGia->pReprs[uVar7] & 0xfffffff) == 0xfffffff) &&
                   (0 < pGia->pNexts[uVar7])) {
                  if (pGia->pNexts[uVar7] < 1) {
                    __assert_fail("Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x8ec,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  uVar10 = 0xffffffff;
                  uVar11 = 0xffffffff;
                  uVar15 = uVar7 & 0xffffffff;
                  do {
                    uVar14 = (uint)uVar15;
                    if ((int)uVar13 <= (int)uVar14) goto LAB_002044de;
                    if (uVar11 == 0xffffffff) {
                      uVar2 = *(ulong *)(pGia->pObjs + uVar15);
                      bVar16 = (uVar2 & 0x4000000040000000) != 0x40000000;
                      uVar11 = uVar14;
                      if (bVar16) {
                        uVar11 = 0xffffffff;
                      }
                      if ((bVar16 || fLatchA == 0) ||
                         ((((uint)uVar2 & 0x9fffffff) == 0x9fffffff &&
                          (uVar11 = uVar14,
                          pGia->vCis->nSize - pGia->nRegs <=
                          (int)((uint)(uVar2 >> 0x20) & 0x1fffffff))))) goto LAB_0020431c;
                      uVar11 = 0xffffffff;
                    }
                    else {
LAB_0020431c:
                      if (uVar10 == 0xffffffff) {
                        uVar2 = *(ulong *)(pGia->pObjs + uVar15);
                        uVar10 = 0xffffffff;
                        if (((uVar2 & 0x4000000040000000) == 0x4000000000000000) &&
                           ((fLatchB == 0 ||
                            ((((uint)uVar2 & 0x9fffffff) == 0x9fffffff &&
                             (pGia->vCis->nSize - pGia->nRegs <=
                              (int)((uint)(uVar2 >> 0x20) & 0x1fffffff))))))) {
                          uVar10 = uVar14;
                        }
                      }
                    }
                    puVar9 = (uint *)(pGia->pNexts + uVar15);
                    uVar15 = (ulong)*puVar9;
                  } while (0 < (int)*puVar9);
                  puVar9 = (uint *)(pGia->pNexts + uVar7);
                  uVar13 = uVar7 & 0xffffffff;
                  do {
                    uVar14 = *puVar9;
                    pGia->pReprs[(int)uVar13] =
                         (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar13] | 0xfffffff);
                    piVar3 = pGia->pNexts;
                    piVar3[(int)uVar13] = 0;
                    puVar9 = (uint *)(piVar3 + (int)uVar14);
                    uVar13 = (ulong)uVar14;
                  } while ((long)(int)uVar14 != 0);
                  pGVar4 = pGia->pReprs;
                  if (((~(uint)pGVar4[uVar7] & 0xfffffff) == 0) && (0 < pGia->pNexts[uVar7])) {
                    __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x903,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  if ((0 < (int)uVar11) && (0 < (int)uVar10)) {
                    uVar14 = uVar10;
                    if ((int)uVar11 < (int)uVar10) {
                      uVar14 = uVar11;
                    }
                    if ((int)uVar10 < (int)uVar11) {
                      uVar10 = uVar11;
                    }
                    if ((int)uVar10 <= (int)uVar14) {
                      __assert_fail("ClassA < ClassB",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                    ,0x90c,
                                    "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                   );
                    }
                    pGia->pNexts[uVar14] = uVar10;
                    pGVar4[uVar10] =
                         (Gia_Rpr_t)((uint)pGVar4[uVar10] & 0xf0000000 | uVar14 & 0xfffffff);
                    if (((~(uint)pGia->pReprs[uVar14] & 0xfffffff) != 0) ||
                       (pGia->pNexts[uVar14] < 1)) {
                      __assert_fail("Gia_ObjIsHead(pGia, ClassA)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                    ,0x910,
                                    "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                   );
                    }
                    local_38 = local_38 + 1;
                  }
                }
                uVar7 = uVar7 + 1;
                uVar13 = (ulong)pGia->nObjs;
              } while ((long)uVar7 < (long)uVar13);
            }
            Abc_Print(1,"The number of two-node classes after filtering = %d.\n",(ulong)local_38);
            Gia_ManCleanMark0(pGia);
            Gia_ManCleanMark1(pGia);
            return 1;
          }
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar12 = "The AIG structure of the miter does not match.\n";
        }
        else {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar12 = "The number of objects in different.\n";
        }
        goto LAB_002040aa;
      }
      Gia_ManStop((Gia_Man_t *)0x0);
      pcVar12 = "Cannot read second file %s.\n";
    }
    Abc_Print(1,pcVar12,pName2);
  }
  return 0;
}

Assistant:

int Gia_ManFilterEquivsForSpeculation( Gia_Man_t * pGia, char * pName1, char * pName2, int fLatchA, int fLatchB )
{
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj;
    int i, iObj, iNext, Counter = 0;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    Gia_ManForEachConst( pGia, i )
    {
        Gia_ObjUnsetRepr( pGia, i );
        assert( pGia->pNexts[i] == 0 );
    }
    Gia_ManForEachClass( pGia, i )
    {
        // find the first colorA and colorB
        int ClassA = -1, ClassB = -1;
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( ClassA == -1 && pObj->fMark0 && !pObj->fMark1 )
            {
                if ( fLatchA && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassA = iObj;
            }
            if ( ClassB == -1 && pObj->fMark1 && !pObj->fMark0 )
            {
                if ( fLatchB && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassB = iObj;
            }
        }
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( ClassA > 0 && ClassB > 0 )
        {
            if ( ClassA > ClassB )
            {
                ClassA ^= ClassB;
                ClassB ^= ClassA;
                ClassA ^= ClassB;
            }
            assert( ClassA < ClassB );
            Gia_ObjSetNext( pGia, ClassA, ClassB );
            Gia_ObjSetRepr( pGia, ClassB, ClassA );
            Counter++;
            assert( Gia_ObjIsHead(pGia, ClassA) );
        }
    }
    Abc_Print( 1, "The number of two-node classes after filtering = %d.\n", Counter );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}